

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O2

void brotli::CompareAndPushToQueue<brotli::Histogram<256>>
               (Histogram<256> *out,uint32_t *cluster_size,uint32_t idx1,uint32_t idx2,
               vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_> *pairs)

{
  pointer pHVar1;
  HistogramPair *p1;
  uint uVar2;
  bool bVar3;
  ulong uVar4;
  double dVar5;
  HistogramPair p;
  Histogram<256> combo;
  HistogramPair local_458;
  double local_440;
  double local_438;
  Histogram<256> local_430;
  
  if (idx1 != idx2) {
    uVar2 = idx1;
    if (idx1 < idx2) {
      uVar2 = idx2;
    }
    uVar4 = (ulong)idx1;
    if (idx2 < idx1) {
      uVar4 = (ulong)idx2;
    }
    local_458.idx1 = (uint32_t)uVar4;
    local_458.idx2 = uVar2;
    dVar5 = ClusterCostDiff((ulong)cluster_size[uVar4],(ulong)cluster_size[uVar2]);
    local_458.cost_combo = out[uVar2].bit_cost_;
    local_458.cost_diff = (dVar5 * 0.5 - out[uVar4].bit_cost_) - local_458.cost_combo;
    if ((out[uVar4].total_count_ != 0) &&
       (local_458.cost_combo = out[uVar4].bit_cost_, out[uVar2].total_count_ != 0)) {
      pHVar1 = (pairs->
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (pHVar1 == (pairs->
                    super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        local_440 = 1e+99;
      }
      else {
        local_440 = pHVar1->cost_diff;
        if (local_440 <= 0.0) {
          local_440 = 0.0;
        }
      }
      local_438 = local_458.cost_diff;
      memcpy(&local_430,out + uVar4,0x410);
      Histogram<256>::AddHistogram(&local_430,out + uVar2);
      local_458.cost_combo = PopulationCost<256>(&local_430);
      local_458.cost_diff = local_438;
      if (local_440 - local_438 <= local_458.cost_combo) {
        return;
      }
    }
    local_458.cost_diff = local_458.cost_combo + local_458.cost_diff;
    p1 = (pairs->super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
         _M_impl.super__Vector_impl_data._M_start;
    if ((p1 == (pairs->
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
               _M_impl.super__Vector_impl_data._M_finish) ||
       (bVar3 = operator<(p1,&local_458), !bVar3)) {
      std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::push_back
                (pairs,&local_458);
    }
    else {
      std::vector<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>::push_back
                (pairs,(pairs->
                       super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>
                       )._M_impl.super__Vector_impl_data._M_start);
      pHVar1 = (pairs->
               super__Vector_base<brotli::HistogramPair,_std::allocator<brotli::HistogramPair>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pHVar1->cost_diff = local_458.cost_diff;
      pHVar1->idx1 = local_458.idx1;
      pHVar1->idx2 = local_458.idx2;
      pHVar1->cost_combo = local_458.cost_combo;
    }
  }
  return;
}

Assistant:

void CompareAndPushToQueue(const HistogramType* out,
                           const uint32_t* cluster_size,
                           uint32_t idx1, uint32_t idx2,
                           std::vector<HistogramPair>* pairs) {
  if (idx1 == idx2) {
    return;
  }
  if (idx2 < idx1) {
    uint32_t t = idx2;
    idx2 = idx1;
    idx1 = t;
  }
  bool store_pair = false;
  HistogramPair p;
  p.idx1 = idx1;
  p.idx2 = idx2;
  p.cost_diff = 0.5 * ClusterCostDiff(cluster_size[idx1], cluster_size[idx2]);
  p.cost_diff -= out[idx1].bit_cost_;
  p.cost_diff -= out[idx2].bit_cost_;

  if (out[idx1].total_count_ == 0) {
    p.cost_combo = out[idx2].bit_cost_;
    store_pair = true;
  } else if (out[idx2].total_count_ == 0) {
    p.cost_combo = out[idx1].bit_cost_;
    store_pair = true;
  } else {
    double threshold = pairs->empty() ? 1e99 :
        std::max(0.0, (*pairs)[0].cost_diff);
    HistogramType combo = out[idx1];
    combo.AddHistogram(out[idx2]);
    double cost_combo = PopulationCost(combo);
    if (cost_combo < threshold - p.cost_diff) {
      p.cost_combo = cost_combo;
      store_pair = true;
    }
  }
  if (store_pair) {
    p.cost_diff += p.cost_combo;
    if (!pairs->empty() && (pairs->front() < p)) {
      // Replace the top of the queue if needed.
      pairs->push_back(pairs->front());
      pairs->front() = p;
    } else {
      pairs->push_back(p);
    }
  }
}